

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tqapi_ffi_tapi.cpp
# Opt level: O2

void tqapi_tapi_free_query_balance_result(TradeApi *tapi,QueryBalanceResult *result)

{
  QueryBalanceResultData *this;
  
  this = result->_data;
  if (this != (QueryBalanceResultData *)0x0) {
    tquant::api::CallResult<const_tquant::api::Balance>::~CallResult(&this->result);
  }
  operator_delete(this);
  operator_delete(result);
  return;
}

Assistant:

void tqapi_tapi_free_query_balance_result (TradeApi* tapi, QueryBalanceResult  * result)
    {
        delete result->_data;
        delete result;
    }